

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_time.cpp
# Opt level: O3

MppTimer mpp_timer_get(char *name)

{
  int __fd;
  int __epfd;
  int iVar1;
  undefined8 *ptr;
  uint32_t local_2c;
  int local_28;
  undefined4 local_24;
  
  ptr = (undefined8 *)mpp_osal_calloc("mpp_timer_get",0x48);
  if (ptr == (undefined8 *)0x0) {
    _mpp_log_l(2,"mpp_time","malloc failed\n","mpp_timer_get");
    _mpp_log_l(2,"mpp_time","failed to create timer\n","mpp_timer_get");
  }
  else {
    __fd = timerfd_create(0,0);
    if (__fd < 0) {
      __epfd = -1;
    }
    else {
      __epfd = epoll_create(1);
      if (-1 < __epfd) {
        local_24 = 0;
        local_2c = 0x80000001;
        local_28 = __fd;
        iVar1 = epoll_ctl(__epfd,1,__fd,(epoll_event *)&local_2c);
        if (-1 < iVar1) {
          *(int *)((long)ptr + 0x24) = __fd;
          *(int *)(ptr + 5) = __epfd;
          *(undefined8 *)((long)ptr + 0x1c) = 0x3e8000003e8;
          *ptr = "mpp_timer";
          snprintf((char *)(ptr + 1),0xf,name,0);
          return ptr;
        }
      }
    }
    _mpp_log_l(2,"mpp_time","failed to create timer\n","mpp_timer_get");
    mpp_osal_free("mpp_timer_get",ptr);
    if (-1 < __fd) {
      close(__fd);
    }
    if (-1 < __epfd) {
      close(__epfd);
    }
  }
  return (MppTimer)0x0;
}

Assistant:

MppTimer mpp_timer_get(const char *name)
{
    RK_S32 timer_fd = -1;
    RK_S32 epoll_fd = -1;
    MppTimerImpl *impl = NULL;

    do {
        struct epoll_event event;

        impl = mpp_calloc(MppTimerImpl, 1);
        if (NULL == impl) {
            mpp_err_f("malloc failed\n");
            break;
        }

        timer_fd = timerfd_create(CLOCK_REALTIME, 0);
        if (timer_fd < 0)
            break;

        epoll_fd = epoll_create(1);
        if (epoll_fd < 0)
            break;

        memset(&event, 0, sizeof(event));
        event.data.fd = timer_fd;
        event.events = EPOLLIN | EPOLLET;

        if (epoll_ctl(epoll_fd, EPOLL_CTL_ADD, timer_fd, &event) < 0)
            break;

        impl->timer_fd = timer_fd;
        impl->epoll_fd = epoll_fd;
        /* default 1 second (1000ms) looper */
        impl->initial  = 1000;
        impl->interval = 1000;
        impl->check = timer_name;
        snprintf(impl->name, sizeof(impl->name) - 1, name, NULL);

        return impl;
    } while (0);

    mpp_err_f("failed to create timer\n");

    if (impl) {
        mpp_free(impl);
        impl = NULL;
    }

    if (timer_fd >= 0) {
        close(timer_fd);
        timer_fd = -1;
    }

    if (epoll_fd >= 0) {
        close(epoll_fd);
        epoll_fd = -1;
    }

    return NULL;
}